

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

void envy_bios_print_bit(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  ushort uVar2;
  envy_bios_bit_entry *peVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = (bios->bit).offset;
  if ((mask & 8) != 0 && uVar1 != 0) {
    uVar2 = (bios->bit).version;
    uVar4 = (ulong)(byte)uVar2;
    uVar6 = (ulong)(uVar2 >> 8);
    if ((bios->bit).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BIT table at 0x%04x version %d.%d\n\n",(ulong)uVar1,uVar6
              ,uVar4);
      return;
    }
    fprintf((FILE *)out,"BIT table at 0x%04x version %d.%d",(ulong)uVar1,uVar6,uVar4);
    fputc(10,(FILE *)out);
    envy_bios_dump_hex(bios,out,(uint)(bios->bit).offset,(uint)(bios->bit).hlen,mask);
    lVar5 = 6;
    for (uVar6 = 0; uVar6 < (bios->bit).entriesnum; uVar6 = uVar6 + 1) {
      peVar3 = (bios->bit).entries;
      fprintf((FILE *)out,"BIT table \'%c\' version %d at 0x%04x length 0x%04x\n",
              (ulong)*(byte *)((long)peVar3 + lVar5 + -4),
              (ulong)*(byte *)((long)peVar3 + lVar5 + -3),
              (ulong)*(ushort *)((long)peVar3 + lVar5 + -2),
              (ulong)*(ushort *)((long)&peVar3->offset + lVar5));
      envy_bios_dump_hex(bios,out,(uint)*(ushort *)((long)peVar3 + lVar5 + -6),
                         (uint)(bios->bit).rlen,mask);
      lVar5 = lVar5 + 10;
    }
    fputc(10,(FILE *)out);
    lVar5 = 8;
    for (uVar6 = 0; uVar6 < (bios->bit).entriesnum; uVar6 = uVar6 + 1) {
      peVar3 = (bios->bit).entries;
      if (*(char *)((long)&peVar3->offset + lVar5) != '\0') {
        fprintf((FILE *)out,"Unknown BIT table \'%c\' version %d\n",
                (ulong)*(byte *)((long)peVar3 + lVar5 + -6),
                (ulong)*(byte *)((long)peVar3 + lVar5 + -5));
        envy_bios_dump_hex(bios,out,(uint)*(ushort *)((long)peVar3 + lVar5 + -4),
                           (uint)*(ushort *)((long)peVar3 + lVar5 + -2),mask);
        fputc(10,(FILE *)out);
      }
      lVar5 = lVar5 + 10;
    }
  }
  return;
}

Assistant:

void envy_bios_print_bit (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_bit *bit = &bios->bit;
	if (!bit->offset || !(mask & ENVY_BIOS_PRINT_BMP_BIT))
		return;
	if (!bit->valid) {
		fprintf(out, "Failed to parse BIT table at 0x%04x version %d.%d\n\n", bit->offset, bit->version >> 8, bit->version & 0xff);
		return;
	}
	fprintf(out, "BIT table at 0x%04x version %d.%d", bit->offset, bit->version >> 8, bit->version & 0xff);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, bit->offset, bit->hlen, mask);
	int i;
	for (i = 0; i < bit->entriesnum; i++) {
		struct envy_bios_bit_entry *entry = &bit->entries[i];
		fprintf (out, "BIT table '%c' version %d at 0x%04x length 0x%04x\n", entry->type, entry->version, entry->t_offset, entry->t_len);
		envy_bios_dump_hex(bios, out, entry->offset, bit->rlen, mask);
	}
	fprintf(out, "\n");
	for (i = 0; i < bit->entriesnum; i++) {
		struct envy_bios_bit_entry *entry = &bit->entries[i];
		if (entry->is_unk) {
			fprintf (out, "Unknown BIT table '%c' version %d\n", entry->type, entry->version);
			envy_bios_dump_hex(bios, out, entry->t_offset, entry->t_len, mask);
			fprintf(out, "\n");
		}
	}
}